

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O3

Int32 main(Int32 argc,Char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Int32 bit;
  int iVar4;
  size_t sVar5;
  FILE *pFVar6;
  BitStream *pBVar7;
  char *pcVar8;
  BitStream *bs;
  uint uVar9;
  Char *pCVar10;
  Int32 n;
  ulong uVar11;
  MaybeUInt64 MVar12;
  uint uVar13;
  Int32 i;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  uint local_64;
  ulong local_60;
  FILE *local_48;
  
  strncpy(progName,*argv,1999);
  progName[1999] = '\0';
  outFileName[0] = '\0';
  inFileName[0] = '\0';
  uVar15 = 1;
  fwrite("bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n",0x3d,1,_stderr);
  if (argc == 2) {
    pcVar8 = argv[1];
    sVar5 = strlen(pcVar8);
    if (sVar5 < 0x7bc) {
      strcpy(inFileName,pcVar8);
      pFVar6 = fopen(inFileName,"rb");
      if (pFVar6 == (FILE *)0x0) {
        pcVar8 = "%s: can\'t read `%s\'\n";
      }
      else {
        pBVar7 = bsOpenReadStream((FILE *)pFVar6);
        local_60 = 0;
        fprintf(_stderr,"%s: searching for block boundaries ...\n",progName);
        bStart[0] = 0;
        iVar3 = bsGetBit(pBVar7);
        if (iVar3 == 2) {
          iVar2 = 0;
          uVar11 = 0;
          local_64 = 0;
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          local_64 = 0;
          iVar2 = 0;
          local_60 = 0;
          uVar11 = 0;
          do {
            uVar15 = uVar11;
            uVar9 = local_64 << 1;
            uVar14 = uVar13 >> 0x1f;
            local_64 = uVar9 | uVar14;
            uVar11 = uVar15 + 1;
            uVar13 = iVar3 + uVar13 * 2;
            uVar14 = uVar9 & 0xffff | uVar14;
            if ((uVar13 == 0x59265359 && uVar14 == 0x3141) ||
               (uVar13 == 0x45385090 && uVar14 == 0x1772)) {
              MVar12 = uVar15 - 0x30;
              if (uVar11 < 0x32) {
                MVar12 = 0;
              }
              uVar9 = (uint)local_60;
              bEnd[(int)uVar9] = MVar12;
              if (0 < (int)uVar9) {
                if (0x81 < MVar12 - bStart[local_60]) {
                  fprintf(_stderr,"   block %d runs from %Lu to %Lu\n");
                  rbStart[iVar2] = bStart[local_60];
                  rbEnd[iVar2] = bEnd[local_60];
                  iVar2 = iVar2 + 1;
                }
                if (49999 < uVar9) {
                  fprintf(_stderr,"%s: `%s\' appears to contain more than %d blocks\n",progName,
                          inFileName,50000);
                  fprintf(_stderr,"%s: and cannot be handled.  To fix, increase\n",progName);
                  pcVar8 = "%s: BZ_MAX_HANDLED_BLOCKS in bzip2recover.c, and recompile.\n";
                  goto LAB_0010197b;
                }
              }
              local_60 = (ulong)(uVar9 + 1);
              bStart[(long)(int)uVar9 + 1] = uVar11;
            }
            iVar3 = bsGetBit(pBVar7);
          } while (iVar3 != 2);
          uVar15 = uVar15 + 2;
        }
        iVar3 = (int)local_60;
        uVar1 = bStart[iVar3];
        if ((0x27 < uVar15 - uVar1 && uVar1 <= uVar15) && (bEnd[iVar3] = uVar11, 0 < iVar3)) {
          fprintf(_stderr,"   block %d runs from %Lu to %Lu (incomplete)\n",local_60,uVar1,uVar11);
        }
        bsClose(pBVar7);
        if (iVar2 < 1) {
          pcVar8 = "%s: sorry, I couldn\'t find any block boundaries.\n";
LAB_0010197b:
          fprintf(_stderr,pcVar8,progName);
          goto LAB_00101a2f;
        }
        fprintf(_stderr,"%s: splitting into blocks\n",progName);
        pFVar6 = fopen(inFileName,"rb");
        if (pFVar6 != (FILE *)0x0) {
          pBVar7 = bsOpenReadStream((FILE *)pFVar6);
          bit = bsGetBit(pBVar7);
          if (bit == 2) {
LAB_0010147e:
            fprintf(_stderr,"%s: finished\n",progName);
            return 0;
          }
          uVar9 = 0;
          uVar15 = 0;
          iVar3 = 0;
          bs = (BitStream *)0x0;
          local_48 = (FILE *)0x0;
LAB_001014c1:
          local_64 = local_64 << 1 | uVar13 >> 0x1f;
          uVar11 = rbStart[iVar3];
          uVar14 = uVar13 * 2 >> 0x10 | local_64 << 0x10;
          if (uVar15 != uVar11 + 0x2f) {
            uVar14 = uVar9;
          }
          uVar9 = uVar14;
          if (local_48 == (FILE *)0x0) {
            if (uVar15 == rbEnd[iVar3]) goto LAB_0010164a;
LAB_0010166a:
            uVar15 = uVar15 + 1;
            if (uVar15 == uVar11) {
              memset(outFileName,0,2000);
              strcpy(outFileName,inFileName);
              pcVar8 = strrchr(outFileName,0x2f);
              pCVar10 = pcVar8 + 1;
              if (pcVar8 == (char *)0x0) {
                pCVar10 = outFileName;
              }
              sprintf(pCVar10,"rec%5d",(ulong)(iVar3 + 1U));
              pcVar8 = pCVar10;
              do {
                if (*pcVar8 == ' ') {
                  *pcVar8 = '0';
                }
                else if (*pcVar8 == '\0') goto LAB_00101706;
                pcVar8 = pcVar8 + 1;
              } while( true );
            }
            goto LAB_0010166f;
          }
          if ((uVar11 <= uVar15) && (uVar15 <= rbEnd[iVar3])) {
            bsPutBit(bs,bit);
          }
          if (uVar15 != rbEnd[iVar3]) {
            uVar11 = rbStart[iVar3];
            goto LAB_0010166a;
          }
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x17U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x72U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x45U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x38U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x50U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 7;
          do {
            bsPutBit(bs,(uint)((0x90U >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          uVar14 = 0x1f;
          do {
            bsPutBit(bs,(uint)((uVar9 >> (uVar14 & 0x1f) & 1) != 0));
            bVar16 = uVar14 != 0;
            uVar14 = uVar14 - 1;
          } while (bVar16);
          bsClose(bs);
LAB_0010164a:
          if (iVar2 <= iVar3) goto LAB_0010147e;
          iVar3 = iVar3 + 1;
          uVar15 = uVar15 + 1;
          goto LAB_0010166f;
        }
        pcVar8 = "%s: can\'t open `%s\'\n";
      }
      pCVar10 = inFileName;
LAB_00101a28:
      fprintf(_stderr,pcVar8,progName,pCVar10);
    }
    else {
      fprintf(_stderr,"%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",progName,
              sVar5 & 0xffffffff);
    }
  }
  else {
    fprintf(_stderr,"%s: usage is `%s damaged_file_name\'.\n",progName);
    fwrite("\trestrictions on size of recovered file: None\n",0x2e,1,_stderr);
  }
LAB_00101a2f:
  exit(1);
LAB_00101706:
  strcat(outFileName,inFileName + ((int)pCVar10 + -0x1048b0));
  sVar5 = strlen(outFileName);
  iVar4 = (int)sVar5;
  if ((((iVar4 < 5) || (outFileName[iVar4 - 4] != '.')) || (outFileName[iVar4 - 3] != 'b')) ||
     ((outFileName[iVar4 - 2] != 'z' || (outFileName[iVar4 - 1] != '2')))) {
    sVar5 = strlen(outFileName);
    builtin_memcpy(outFileName + sVar5,".bz2",4);
    outFileName[sVar5 + 4] = '\0';
  }
  fprintf(_stderr,"   writing block %d to `%s\' ...\n",(ulong)(iVar3 + 1U),outFileName);
  local_48 = fopen(outFileName,"wb");
  if (local_48 == (FILE *)0x0) {
    pcVar8 = "%s: can\'t write `%s\'\n";
    pCVar10 = outFileName;
    goto LAB_00101a28;
  }
  n = 0x18;
  bs = (BitStream *)malloc(0x18);
  if (bs == (BitStream *)0x0) {
    mallocFail(n);
  }
  bs->handle = (FILE *)local_48;
  bs->buffer = 0;
  bs->buffLive = 0;
  bs->mode = 'w';
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x42U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x5aU >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x68U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x39U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x31U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x41U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x59U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x26U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x53U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar16);
  uVar14 = 7;
  do {
    bsPutBit(bs,(uint)((0x59U >> (uVar14 & 0x1f) & 1) != 0));
    bVar16 = uVar14 != 0;
    uVar14 = uVar14 - 1;
    uVar15 = uVar11;
  } while (bVar16);
LAB_0010166f:
  uVar13 = bit + uVar13 * 2;
  bit = bsGetBit(pBVar7);
  if (bit == 2) goto LAB_0010147e;
  goto LAB_001014c1;
}

Assistant:

Int32 main ( Int32 argc, Char** argv )
{
   FILE*       inFile;
   FILE*       outFile;
   BitStream*  bsIn, *bsWr;
   Int32       b, wrBlock, currBlock, rbCtr;
   MaybeUInt64 bitsRead;

   UInt32      buffHi, buffLo, blockCRC;
   Char*       p;

   strncpy ( progName, argv[0], BZ_MAX_FILENAME-1);
   progName[BZ_MAX_FILENAME-1]='\0';
   inFileName[0] = outFileName[0] = 0;

   fprintf ( stderr, 
             "bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n" );

   if (argc != 2) {
      fprintf ( stderr, "%s: usage is `%s damaged_file_name'.\n",
                        progName, progName );
      switch (sizeof(MaybeUInt64)) {
         case 8:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: None\n");
            break;
         case 4:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: 512 MB\n");
            fprintf(stderr, 
                    "\tto circumvent, recompile with MaybeUInt64 as an\n"
                    "\tunsigned 64-bit int.\n");
            break;
         default:
            fprintf(stderr, 
                    "\tsizeof(MaybeUInt64) is not 4 or 8 -- "
                    "configuration error.\n");
            break;
      }
      exit(1);
   }

   if (strlen(argv[1]) >= BZ_MAX_FILENAME-20) {
      fprintf ( stderr, 
                "%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",
                progName, (int)strlen(argv[1]) );
      exit(1);
   }

   strcpy ( inFileName, argv[1] );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't read `%s'\n", progName, inFileName );
      exit(1);
   }

   bsIn = bsOpenReadStream ( inFile );
   fprintf ( stderr, "%s: searching for block boundaries ...\n", progName );

   bitsRead = 0;
   buffHi = buffLo = 0;
   currBlock = 0;
   bStart[currBlock] = 0;

   rbCtr = 0;

   while (True) {
      b = bsGetBit ( bsIn );
      bitsRead++;
      if (b == 2) {
         if (bitsRead >= bStart[currBlock] &&
            (bitsRead - bStart[currBlock]) >= 40) {
            bEnd[currBlock] = bitsRead-1;
            if (currBlock > 0)
               fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                                 " to " MaybeUInt64_FMT " (incomplete)\n",
                         currBlock,  bStart[currBlock], bEnd[currBlock] );
         } else
            currBlock--;
         break;
      }
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if ( ( (buffHi & 0x0000ffff) == BLOCK_HEADER_HI 
             && buffLo == BLOCK_HEADER_LO)
           || 
           ( (buffHi & 0x0000ffff) == BLOCK_ENDMARK_HI 
             && buffLo == BLOCK_ENDMARK_LO)
         ) {
         if (bitsRead > 49) {
            bEnd[currBlock] = bitsRead-49;
         } else {
            bEnd[currBlock] = 0;
         }
         if (currBlock > 0 &&
	     (bEnd[currBlock] - bStart[currBlock]) >= 130) {
            fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                              " to " MaybeUInt64_FMT "\n",
                      rbCtr+1,  bStart[currBlock], bEnd[currBlock] );
            rbStart[rbCtr] = bStart[currBlock];
            rbEnd[rbCtr] = bEnd[currBlock];
            rbCtr++;
         }
         if (currBlock >= BZ_MAX_HANDLED_BLOCKS)
            tooManyBlocks(BZ_MAX_HANDLED_BLOCKS);
         currBlock++;

         bStart[currBlock] = bitsRead;
      }
   }

   bsClose ( bsIn );

   /*-- identified blocks run from 1 to rbCtr inclusive. --*/

   if (rbCtr < 1) {
      fprintf ( stderr,
                "%s: sorry, I couldn't find any block boundaries.\n",
                progName );
      exit(1);
   };

   fprintf ( stderr, "%s: splitting into blocks\n", progName );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't open `%s'\n", progName, inFileName );
      exit(1);
   }
   bsIn = bsOpenReadStream ( inFile );

   /*-- placate gcc's dataflow analyser --*/
   blockCRC = 0; bsWr = 0;

   bitsRead = 0;
   outFile = NULL;
   wrBlock = 0;
   while (True) {
      b = bsGetBit(bsIn);
      if (b == 2) break;
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if (bitsRead == 47+rbStart[wrBlock]) 
         blockCRC = (buffHi << 16) | (buffLo >> 16);

      if (outFile != NULL && bitsRead >= rbStart[wrBlock]
                          && bitsRead <= rbEnd[wrBlock]) {
         bsPutBit ( bsWr, b );
      }

      bitsRead++;

      if (bitsRead == rbEnd[wrBlock]+1) {
         if (outFile != NULL) {
            bsPutUChar ( bsWr, 0x17 ); bsPutUChar ( bsWr, 0x72 );
            bsPutUChar ( bsWr, 0x45 ); bsPutUChar ( bsWr, 0x38 );
            bsPutUChar ( bsWr, 0x50 ); bsPutUChar ( bsWr, 0x90 );
            bsPutUInt32 ( bsWr, blockCRC );
            bsClose ( bsWr );
         }
         if (wrBlock >= rbCtr) break;
         wrBlock++;
      } else
      if (bitsRead == rbStart[wrBlock]) {
         /* Create the output file name, correctly handling leading paths. 
            (31.10.2001 by Sergey E. Kusikov) */
         Char* split;
         Int32 ofs, k;
         for (k = 0; k < BZ_MAX_FILENAME; k++) 
            outFileName[k] = 0;
         strcpy (outFileName, inFileName);
         split = strrchr (outFileName, BZ_SPLIT_SYM);
         if (split == NULL) {
            split = outFileName;
         } else {
            ++split;
	 }
	 /* Now split points to the start of the basename. */
         ofs  = split - outFileName;
         sprintf (split, "rec%5d", wrBlock+1);
         for (p = split; *p != 0; p++) if (*p == ' ') *p = '0';
         strcat (outFileName, inFileName + ofs);

         if ( !endsInBz2(outFileName)) strcat ( outFileName, ".bz2" );

         fprintf ( stderr, "   writing block %d to `%s' ...\n",
                           wrBlock+1, outFileName );

         outFile = fopen ( outFileName, "wb" );
         if (outFile == NULL) {
            fprintf ( stderr, "%s: can't write `%s'\n",
                      progName, outFileName );
            exit(1);
         }
         bsWr = bsOpenWriteStream ( outFile );
         bsPutUChar ( bsWr, BZ_HDR_B );    
         bsPutUChar ( bsWr, BZ_HDR_Z );    
         bsPutUChar ( bsWr, BZ_HDR_h );    
         bsPutUChar ( bsWr, BZ_HDR_0 + 9 );
         bsPutUChar ( bsWr, 0x31 ); bsPutUChar ( bsWr, 0x41 );
         bsPutUChar ( bsWr, 0x59 ); bsPutUChar ( bsWr, 0x26 );
         bsPutUChar ( bsWr, 0x53 ); bsPutUChar ( bsWr, 0x59 );
      }
   }

   fprintf ( stderr, "%s: finished\n", progName );
   return 0;
}